

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Track.cpp
# Opt level: O1

void __thiscall MIDI::Track::Track(Track *this,byte *data,dword size)

{
  pointer *pppEVar1;
  dword *pdVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte *pbVar6;
  iterator iVar7;
  vector<MIDI::Event*,std::allocator<MIDI::Event*>> *pvVar8;
  uint uVar9;
  byte command;
  dword dVar10;
  MetaTextEvent *pMVar11;
  byte i;
  long lVar12;
  uint uVar13;
  dword dVar14;
  ulong uVar15;
  long lVar16;
  dword result;
  ulong uVar17;
  undefined1 *puVar18;
  dword dVar19;
  ulong uVar20;
  dword dVar21;
  byte *pbVar22;
  ulong uVar23;
  undefined1 auStack_68 [8];
  undefined1 *local_60;
  MetaTextEvent *local_58;
  vector<MIDI::Event*,std::allocator<MIDI::Event*>> *local_50;
  Track *local_48;
  uint local_3c;
  uint local_38;
  byte local_31;
  
  puVar18 = auStack_68;
  Chunk::Chunk(&this->super_Chunk);
  (this->super_Chunk)._vptr_Chunk = (_func_int **)&PTR_data_0010ab90;
  this->_data = data;
  this->_size = size;
  this->_pos = 0;
  (this->_events).super__Vector_base<MIDI::Event_*,_std::allocator<MIDI::Event_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_events).super__Vector_base<MIDI::Event_*,_std::allocator<MIDI::Event_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_events).super__Vector_base<MIDI::Event_*,_std::allocator<MIDI::Event_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (size != 0) {
    pdVar2 = &this->_pos;
    local_50 = (vector<MIDI::Event*,std::allocator<MIDI::Event*>> *)&this->_events;
    uVar20 = 0;
    local_48 = this;
    do {
      pbVar22 = local_48->_data;
      uVar23 = 0;
      lVar16 = uVar20 - 1;
      dVar21 = uVar20 + 4;
      dVar10 = uVar20 + 3;
      do {
        dVar14 = dVar10;
        dVar19 = dVar21;
        lVar12 = lVar16;
        bVar3 = pbVar22[lVar12 + 1];
        uVar23 = uVar23 << 7 | (ulong)(bVar3 & 0x7f);
        *pdVar2 = lVar12 + 2;
        lVar16 = lVar12 + 1;
        dVar21 = dVar19 + 1;
        dVar10 = dVar14 + 1;
      } while ((char)bVar3 < '\0');
      bVar3 = pbVar22[lVar12 + 2];
      dVar21 = lVar12 + 3;
      *pdVar2 = dVar21;
      if (bVar3 == 0xf0) {
LAB_00106283:
        uVar20 = 0;
        do {
          bVar3 = pbVar22[dVar14 - 1];
          uVar23 = uVar20 * 0x80;
          uVar20 = bVar3 & 0x7f | uVar23;
          *pdVar2 = dVar14;
          dVar14 = dVar14 + 1;
        } while ((char)bVar3 < '\0');
        if (uVar20 != 0) {
          *pdVar2 = uVar23 + *pdVar2 + (ulong)bVar3;
        }
      }
      else if (bVar3 == 0xff) {
        local_38 = (uint)pbVar22[lVar12 + 3];
        *pdVar2 = lVar12 + 4;
        uVar20 = 0;
        do {
          bVar3 = pbVar22[dVar19 - 1];
          uVar13 = bVar3 & 0x7f;
          uVar17 = uVar20 << 7;
          uVar20 = uVar17 | uVar13;
          *pdVar2 = dVar19;
          dVar19 = dVar19 + 1;
        } while ((char)bVar3 < '\0');
        lVar16 = -(uVar20 + 0xf & 0xfffffffffffffff0);
        pbVar22 = puVar18 + lVar16;
        local_60 = puVar18;
        if (uVar20 != 0) {
          dVar21 = local_48->_pos;
          pbVar6 = local_48->_data;
          uVar15 = 0;
          do {
            bVar4 = pbVar6[uVar15 + dVar21];
            *pdVar2 = dVar21 + 1 + uVar15;
            pbVar22[uVar15] = bVar4;
            uVar15 = uVar15 + 1;
          } while (uVar15 < uVar20);
        }
        if ((local_38 < 7) && ((0x4eU >> (local_38 & 0x1f) & 1) != 0)) {
          builtin_memcpy(puVar18 + lVar16 + -8,"Mc\x10",4);
          pbVar22[-4] = '\0';
          pbVar22[-3] = '\0';
          pbVar22[-2] = '\0';
          pbVar22[-1] = '\0';
          pMVar11 = (MetaTextEvent *)operator_new(0x38);
          uVar13 = local_38;
          builtin_memcpy(puVar18 + lVar16 + -8,"dc\x10",4);
          pbVar22[-4] = '\0';
          pbVar22[-3] = '\0';
          pbVar22[-2] = '\0';
          pbVar22[-1] = '\0';
          MetaTextEvent::MetaTextEvent(pMVar11,uVar23,(byte)uVar13,pbVar22,uVar20);
        }
        else if (local_38 == 0x51) {
          builtin_memcpy(puVar18 + lVar16 + -8,"7d\x10",4);
          pbVar22[-4] = '\0';
          pbVar22[-3] = '\0';
          pbVar22[-2] = '\0';
          pbVar22[-1] = '\0';
          pMVar11 = (MetaTextEvent *)operator_new(0x20);
          uVar13 = local_38;
          builtin_memcpy(puVar18 + lVar16 + -8,"Nd\x10",4);
          pbVar22[-4] = '\0';
          pbVar22[-3] = '\0';
          pbVar22[-2] = '\0';
          pbVar22[-1] = '\0';
          MetaNumberEvent::MetaNumberEvent
                    ((MetaNumberEvent *)pMVar11,uVar23,(byte)uVar13,pbVar22,uVar20);
        }
        else {
          builtin_memcpy(puVar18 + lVar16 + -8,"Zd\x10",4);
          pbVar22[-4] = '\0';
          pbVar22[-3] = '\0';
          pbVar22[-2] = '\0';
          pbVar22[-1] = '\0';
          pMVar11 = (MetaTextEvent *)operator_new(0x28);
          uVar9 = local_38;
          builtin_memcpy(puVar18 + lVar16 + -8,"qd\x10",4);
          pbVar22[-4] = '\0';
          pbVar22[-3] = '\0';
          pbVar22[-2] = '\0';
          pbVar22[-1] = '\0';
          MetaGenericEvent::MetaGenericEvent
                    ((MetaGenericEvent *)pMVar11,uVar23,(byte)uVar9,pbVar22,(uint)uVar17 | uVar13);
        }
        pvVar8 = local_50;
        iVar7._M_current =
             (local_48->_events).super__Vector_base<MIDI::Event_*,_std::allocator<MIDI::Event_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        local_58 = pMVar11;
        if (iVar7._M_current ==
            (local_48->_events).super__Vector_base<MIDI::Event_*,_std::allocator<MIDI::Event_*>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          pbVar22[-8] = 0x9a;
          pbVar22[-7] = 'd';
          pbVar22[-6] = '\x10';
          pbVar22[-5] = '\0';
          pbVar22[-4] = '\0';
          pbVar22[-3] = '\0';
          pbVar22[-2] = '\0';
          pbVar22[-1] = '\0';
          std::vector<MIDI::Event*,std::allocator<MIDI::Event*>>::_M_realloc_insert<MIDI::Event*>
                    (pvVar8,iVar7,(Event **)&local_58);
          puVar18 = local_60;
        }
        else {
          *iVar7._M_current = (Event *)pMVar11;
          pppEVar1 = &(local_48->_events).
                      super__Vector_base<MIDI::Event_*,_std::allocator<MIDI::Event_*>_>._M_impl.
                      super__Vector_impl_data._M_finish;
          *pppEVar1 = *pppEVar1 + 1;
          puVar18 = local_60;
        }
      }
      else {
        if (bVar3 == 0xf7) goto LAB_00106283;
        lVar16 = 3;
        if ((char)bVar3 < '\0') {
          local_31 = bVar3 >> 4;
          local_3c = bVar3 & 0xf;
          bVar3 = pbVar22[lVar12 + 3];
          dVar21 = lVar12 + 4;
          *pdVar2 = dVar21;
          lVar16 = 4;
        }
        bVar5 = pbVar22[dVar21];
        *pdVar2 = lVar16 + lVar12 + 1;
        if (local_31 == 0xb) {
          *(undefined8 *)(puVar18 + -8) = 0x1063ba;
          pMVar11 = (MetaTextEvent *)operator_new(0x28);
          uVar13 = local_3c;
          *(undefined8 *)(puVar18 + -8) = 0x1063d2;
          ChannelControllerEvent::ChannelControllerEvent
                    ((ChannelControllerEvent *)pMVar11,uVar23,uVar13,(uint)bVar3,(uint)bVar5);
        }
        else {
          *(undefined8 *)(puVar18 + -8) = 0x1063de;
          pMVar11 = (MetaTextEvent *)operator_new(0x20);
          command = local_31;
          uVar13 = local_3c;
          *(undefined8 *)(puVar18 + -8) = 0x1063fa;
          ChannelEvent::ChannelEvent
                    ((ChannelEvent *)pMVar11,uVar23,command,uVar13,(uint)bVar3,(uint)bVar5);
        }
        pvVar8 = local_50;
        iVar7._M_current =
             (local_48->_events).super__Vector_base<MIDI::Event_*,_std::allocator<MIDI::Event_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        local_58 = pMVar11;
        if (iVar7._M_current ==
            (local_48->_events).super__Vector_base<MIDI::Event_*,_std::allocator<MIDI::Event_*>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          *(undefined8 *)(puVar18 + -8) = 0x106426;
          std::vector<MIDI::Event*,std::allocator<MIDI::Event*>>::_M_realloc_insert<MIDI::Event*>
                    (pvVar8,iVar7,(Event **)&local_58);
        }
        else {
          *iVar7._M_current = (Event *)pMVar11;
          pppEVar1 = &(local_48->_events).
                      super__Vector_base<MIDI::Event_*,_std::allocator<MIDI::Event_*>_>._M_impl.
                      super__Vector_impl_data._M_finish;
          *pppEVar1 = *pppEVar1 + 1;
        }
      }
      uVar20 = local_48->_pos;
    } while (uVar20 < local_48->_size);
  }
  return;
}

Assistant:

Track::Track(byte* data,dword size)
    : _data(data),_size(size),_pos(0)
  {
    byte lastMIDICommand;
    int lastChannel;
    
    while(_pos<_size)
      {
	dword deltaTime=readNextVariableLength();
	byte eventType=readNextByte();
	
	switch(eventType)
	  {
	  case 0xFF: //Meta event
	    {
	      byte type=readNextByte();
	      dword length=readNextVariableLength();
	      byte metaData[length];
	      for(int i=0;i<length;i++)
		{
		  metaData[i]=readNextByte();
		}
	      
	      MetaEvent *event;
	      switch(type)
		{
		case MIDI_METAEVENT_TEXT:
		case MIDI_METAEVENT_COPYRIGHT:
		case MIDI_METAEVENT_TRACKNAME:
		case MIDI_METAEVENT_MAKER:
		  event=new MetaTextEvent(deltaTime,type,metaData,length);
		  break;
		case MIDI_METAEVENT_SETTEMPO:
		  event=new MetaNumberEvent(deltaTime,type,metaData,length);
		  break;
		default:
		  event=new MetaGenericEvent(deltaTime,type,metaData,length);
		  break;
		}
	      _events.push_back(event);
	    }
	    break;
	  case 0xF0: // System Exclusive Events
	  case 0xF7:
	    {
	      dword length=readNextVariableLength();
	      byte sysData[length];
	      for(int i=0;i<length;i++)
		{
		  sysData[i]=readNextByte();
		}
#warning "System Exclusive events are unimplemented"
	      // IGNORE
	    }
	    break;
	  default:
	    { // Everything else is a channel event
	      byte command;
	      int channel;
	      byte param1;
	      byte param2;
	      
	      if((eventType>>7)==1) // MSB of 1 indicates that the first 4 bits are the channel event type
		{
		  /*
		   * 4 bits:event type
		   * 4 bits:channel
		   * 1 byte:param1
		   * 1 byte:param2
		   */
		  command=(0xF0&eventType)>>4;
		  channel=(int)(0x0F & eventType);
		  param1=readNextByte();
		  param2=readNextByte();
		}
	      else // This is a running status, since MSB==0
		{
		  /*
		   * Event type/channel are from previous event
		   * 1 byte:param1
		   * 1 byte:param2
		   */
		  command=lastMIDICommand;
		  channel=lastChannel;
		  param1=eventType;
		  param2=readNextByte();
		}
	      
	      // Store the event
	      ChannelEvent *event=0;
	      if(command==MIDI_CHEVENT_CONTROLLER)
		event=new ChannelControllerEvent(deltaTime,channel,param1,param2);
	      else
		event=new ChannelEvent(deltaTime,command,channel,param1,param2);
	      
	      _events.push_back(event);
	      
	      lastMIDICommand=command;
	      lastChannel=channel;
	    }
	    break;
	  }
      }
  }